

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int32_t zng_gzungetc(int c,gzFile file)

{
  int iVar1;
  uchar *puVar2;
  gz_state *in_RSI;
  int in_EDI;
  uchar *dest;
  uchar *src;
  gz_state *state;
  gz_state *in_stack_ffffffffffffffd8;
  uchar *puVar3;
  off64_t in_stack_ffffffffffffffe0;
  gz_state *msg;
  int in_stack_fffffffffffffffc;
  
  if (in_RSI == (gz_state *)0x0) {
    in_EDI = -1;
  }
  else {
    msg = in_RSI;
    if (((in_RSI->mode == 0x1c4f) && (in_RSI->how == 0)) && ((in_RSI->x).have == 0)) {
      gz_look(in_stack_ffffffffffffffd8);
    }
    if ((in_RSI->mode == 0x1c4f) && ((in_RSI->err == 0 || (in_RSI->err == -5)))) {
      if (in_RSI->seek != 0) {
        in_RSI->seek = 0;
        iVar1 = gz_skip(in_RSI,in_stack_ffffffffffffffe0);
        if (iVar1 == -1) {
          return -1;
        }
      }
      if (in_EDI < 0) {
        in_EDI = -1;
      }
      else if ((in_RSI->x).have == 0) {
        (in_RSI->x).have = 1;
        (in_RSI->x).next = in_RSI->out + ((ulong)(in_RSI->size << 1) - 1);
        *(in_RSI->x).next = (uchar)in_EDI;
        (in_RSI->x).pos = (in_RSI->x).pos + -1;
        in_RSI->past = 0;
      }
      else if ((in_RSI->x).have == in_RSI->size * 2) {
        gz_error((gz_state *)dest,in_stack_fffffffffffffffc,(char *)msg);
        in_EDI = -1;
      }
      else {
        if ((in_RSI->x).next == in_RSI->out) {
          puVar3 = in_RSI->out + (in_RSI->size << 1);
          for (puVar2 = in_RSI->out + (in_RSI->x).have; in_RSI->out < puVar2; puVar2 = puVar2 + -1)
          {
            puVar3[-1] = puVar2[-1];
            puVar3 = puVar3 + -1;
          }
          (in_RSI->x).next = puVar3;
        }
        (in_RSI->x).have = (in_RSI->x).have + 1;
        (in_RSI->x).next = (in_RSI->x).next + -1;
        *(in_RSI->x).next = (uchar)in_EDI;
        (in_RSI->x).pos = (in_RSI->x).pos + -1;
        in_RSI->past = 0;
      }
    }
    else {
      in_EDI = -1;
    }
  }
  return in_EDI;
}

Assistant:

int Z_EXPORT PREFIX(gzungetc)(int c, gzFile file) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;

    /* in case this was just opened, set up the input buffer */
    if (state->mode == GZ_READ && state->how == LOOK && state->x.have == 0)
        (void)gz_look(state);

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ || (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->x.have == 0) {
        state->x.have = 1;
        state->x.next = state->out + (state->size << 1) - 1;
        state->x.next[0] = (unsigned char)c;
        state->x.pos--;
        state->past = 0;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->x.have == (state->size << 1)) {
        gz_error(state, Z_DATA_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->x.next == state->out) {
        unsigned char *src = state->out + state->x.have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->x.next = dest;
    }
    state->x.have++;
    state->x.next--;
    state->x.next[0] = (unsigned char)c;
    state->x.pos--;
    state->past = 0;
    return c;
}